

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wdgl.cpp
# Opt level: O3

void rw::wdgl::skinUninstanceCB(Geometry *geo)

{
  AttribDesc *a;
  Skin *this;
  InstanceDataHeader *pIVar1;
  float *__src;
  undefined1 auVar2 [16];
  int iVar3;
  long lVar4;
  uint8 *src;
  uint8 *puVar5;
  undefined1 (*dst) [16];
  undefined1 auVar6 [16];
  float fVar7;
  
  this = *(Skin **)((long)geo->texCoords + (long)skinGlobals + -0x38);
  if (this == (Skin *)0x0) {
    return;
  }
  pIVar1 = geo->instData;
  puVar5 = this->data;
  __src = this->inverseMatrices;
  Skin::init(this,(EVP_PKEY_CTX *)(ulong)(uint)this->numBones);
  memcpy(this->inverseMatrices,__src,(long)this->numBones << 6);
  (*DAT_0014ada0)(puVar5);
  if (0 < (int)pIVar1[1].platform) {
    puVar5 = this->indices;
    dst = (undefined1 (*) [16])this->weights;
    lVar4 = 0;
    do {
      a = (AttribDesc *)(*(long *)(pIVar1 + 2) + lVar4 * 0x18);
      src = (uint8 *)((ulong)a->offset + *(long *)(pIVar1 + 6));
      if (a->index == 4) {
        if (0 < geo->numVertices) {
          iVar3 = 0;
          do {
            unpackattrib((float *)dst,src,a,1.0);
            auVar6 = *dst;
            fVar7 = auVar6._12_4_ + auVar6._8_4_ + auVar6._4_4_ + auVar6._0_4_;
            if ((fVar7 != 0.0) || (NAN(fVar7))) {
              auVar2._4_4_ = fVar7;
              auVar2._0_4_ = fVar7;
              auVar2._8_4_ = fVar7;
              auVar2._12_4_ = fVar7;
              auVar6 = divps(auVar6,auVar2);
              *dst = auVar6;
            }
            dst = dst + 1;
            src = src + a->stride;
            iVar3 = iVar3 + 1;
          } while (iVar3 < geo->numVertices);
        }
      }
      else if ((a->index == 5) && (0 < geo->numVertices)) {
        iVar3 = 0;
        do {
          *puVar5 = *src;
          puVar5[1] = src[1];
          puVar5[2] = src[2];
          puVar5[3] = src[3];
          puVar5 = puVar5 + 4;
          src = src + a->stride;
          iVar3 = iVar3 + 1;
        } while (iVar3 < geo->numVertices);
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < (int)pIVar1[1].platform);
  }
  Skin::findNumWeights(this,geo->numVertices);
  Skin::findUsedBones(this,geo->numVertices);
  return;
}

Assistant:

void*
destroyNativeData(void *object, int32, int32)
{
	Geometry *geometry = (Geometry*)object;
	if(geometry->instData == nil ||
	   geometry->instData->platform != PLATFORM_WDGL)
		return object;
	InstanceDataHeader *header =
		(InstanceDataHeader*)geometry->instData;
	geometry->instData = nil;
	// TODO: delete ibo and vbo
	rwFree(header->attribs);
	rwFree(header->data);
	rwFree(header);
	return object;
}